

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeFunction * __thiscall
ExpressionContext::GetFunctionType
          (ExpressionContext *this,SynBase *source,TypeBase *returnType,
          ArrayView<ArgumentData> arguments)

{
  TypeBase *pTVar1;
  IntrusiveList<TypeHandle> arguments_00;
  int iVar2;
  ArgumentData *pAVar3;
  TypeFunction *pTVar4;
  undefined4 extraout_var;
  uint i;
  uint index;
  ulong uVar5;
  uint uVar6;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_local;
  IntrusiveList<TypeHandle> argumentTypes;
  TypeHandle *node;
  
  uVar5 = arguments._8_8_;
  arguments_local.data = arguments.data;
  arguments_local.count = arguments.count;
  if (returnType != (TypeBase *)0x0) {
    if (returnType->typeID - 0x1a < 3) {
      __assert_fail("!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x773,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                   );
    }
    if (returnType->typeID == 0) {
      __assert_fail("!isType<TypeError>(returnType)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x774,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                   );
    }
  }
  uVar6 = returnType->nameHash;
  index = 0;
  do {
    if ((uint)uVar5 <= index) {
      arguments_01._8_8_ = uVar5;
      arguments_01.data = arguments_local.data;
      pTVar4 = GetFunctionTypeFromCache(&this->functionTypeMap,uVar6,returnType,arguments_01);
      if (pTVar4 == (TypeFunction *)0x0) {
        argumentTypes.head = (TypeHandle *)0x0;
        argumentTypes.tail = (TypeHandle *)0x0;
        for (uVar6 = 0; uVar6 < arguments_local.count; uVar6 = uVar6 + 1) {
          iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
          node = (TypeHandle *)CONCAT44(extraout_var,iVar2);
          pAVar3 = ArrayView<ArgumentData>::operator[](&arguments_local,uVar6);
          node->type = pAVar3->type;
          node->next = (TypeHandle *)0x0;
          node->listed = false;
          IntrusiveList<TypeHandle>::push_back(&argumentTypes,node);
        }
        arguments_00.tail = argumentTypes.tail;
        arguments_00.head = argumentTypes.head;
        pTVar4 = GetFunctionType(this,source,returnType,arguments_00);
      }
      return pTVar4;
    }
    pAVar3 = ArrayView<ArgumentData>::operator[](&arguments_local,index);
    pTVar1 = pAVar3->type;
    if (pTVar1 != (TypeBase *)0x0) {
      if (pTVar1->typeID - 0x1a < 3) {
        __assert_fail("!isType<TypeArgumentSet>(curr) && !isType<TypeMemberSet>(curr) && !isType<TypeFunctionSet>(curr)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x77e,
                      "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                     );
      }
      if (pTVar1->typeID == 0) {
        __assert_fail("!isType<TypeError>(curr)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x77f,
                      "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                     );
      }
    }
    if (pTVar1 == this->typeAuto) {
      __assert_fail("curr != typeAuto",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x782,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                   );
    }
    uVar6 = uVar6 * 3 + pTVar1->nameHash;
    index = index + 1;
    uVar5 = (ulong)arguments_local.count;
  } while( true );
}

Assistant:

TypeFunction* ExpressionContext::GetFunctionType(SynBase *source, TypeBase* returnType, ArrayView<ArgumentData> arguments)
{
	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType));
	assert(!isType<TypeError>(returnType));

	unsigned hash = returnType->nameHash;

	for(unsigned i = 0; i < arguments.size(); i++)
	{
		TypeBase *curr = arguments[i].type;

		(void)curr;

		assert(!isType<TypeArgumentSet>(curr) && !isType<TypeMemberSet>(curr) && !isType<TypeFunctionSet>(curr));
		assert(!isType<TypeError>(curr));

		// Can't have auto as argument
		assert(curr != typeAuto);

		hash = (hash << 1) + hash + curr->nameHash;
	}

	if(TypeFunction *prev = GetFunctionTypeFromCache(functionTypeMap, hash, returnType, arguments))
		return prev;

	IntrusiveList<TypeHandle> argumentTypes;

	for(unsigned i = 0; i < arguments.size(); i++)
		argumentTypes.push_back(new (get<TypeHandle>()) TypeHandle(arguments[i].type));

	return GetFunctionType(source, returnType, argumentTypes);
}